

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

SUNLinearSolver SUNLinSol_SPTFQMR(N_Vector y,int pretype,int maxl,SUNContext_conflict sunctx)

{
  SUNLinearSolver p_Var1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  SUNLinearSolverContent_SPTFQMR content;
  SUNLinearSolver S;
  SUNContext_conflict sunctx_local_scope_;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  if ((((in_ESI != 0) && (in_ESI != 1)) && (in_ESI != 2)) && (in_ESI != 3)) {
    local_c = 0;
  }
  local_10 = in_EDX;
  if (in_EDX < 1) {
    local_10 = 5;
  }
  p_Var1 = (SUNLinearSolver)SUNLinSolNewEmpty(in_RCX);
  p_Var1->ops->gettype = SUNLinSolGetType_SPTFQMR;
  p_Var1->ops->getid = SUNLinSolGetID_SPTFQMR;
  p_Var1->ops->setatimes = SUNLinSolSetATimes_SPTFQMR;
  p_Var1->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPTFQMR;
  p_Var1->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPTFQMR;
  p_Var1->ops->setzeroguess = SUNLinSolSetZeroGuess_SPTFQMR;
  p_Var1->ops->initialize = SUNLinSolInitialize_SPTFQMR;
  p_Var1->ops->setup = SUNLinSolSetup_SPTFQMR;
  p_Var1->ops->solve = SUNLinSolSolve_SPTFQMR;
  p_Var1->ops->numiters = SUNLinSolNumIters_SPTFQMR;
  p_Var1->ops->resnorm = SUNLinSolResNorm_SPTFQMR;
  p_Var1->ops->resid = SUNLinSolResid_SPTFQMR;
  p_Var1->ops->lastflag = SUNLinSolLastFlag_SPTFQMR;
  p_Var1->ops->space = SUNLinSolSpace_SPTFQMR;
  p_Var1->ops->free = SUNLinSolFree_SPTFQMR;
  piVar2 = (int *)malloc(0xa8);
  p_Var1->content = piVar2;
  piVar2[6] = 0;
  *piVar2 = local_10;
  piVar2[1] = local_c;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[0x16] = 0;
  piVar2[0x17] = 0;
  piVar2[0x18] = 0;
  piVar2[0x19] = 0;
  piVar2[0x1a] = 0;
  piVar2[0x1b] = 0;
  piVar2[0x1c] = 0;
  piVar2[0x1d] = 0;
  piVar2[0x1e] = 0;
  piVar2[0x1f] = 0;
  piVar2[0x20] = 0;
  piVar2[0x21] = 0;
  piVar2[0x22] = 0;
  piVar2[0x23] = 0;
  piVar2[0x24] = 0;
  piVar2[0x25] = 0;
  piVar2[0x26] = 0;
  piVar2[0x27] = 0;
  piVar2[0x28] = 0;
  piVar2[0x29] = 0;
  piVar2[0x12] = 0;
  piVar2[0x13] = 0;
  piVar2[0x14] = 0;
  piVar2[0x15] = 0;
  piVar2[8] = 0;
  piVar2[9] = 0;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  piVar2[0x10] = 0;
  piVar2[0x11] = 0;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x16) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x18) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x1a) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x1c) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x1e) = uVar3;
  uVar3 = N_VCloneVectorArray(2,in_RDI);
  *(undefined8 *)(piVar2 + 0x20) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x22) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x24) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x26) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x28) = uVar3;
  return p_Var1;
}

Assistant:

SUNLinearSolver SUNLinSol_SPTFQMR(N_Vector y, int pretype, int maxl,
                                  SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_SPTFQMR content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE) && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
  {
    pretype = SUN_PREC_NONE;
  }
  if (maxl <= 0) { maxl = SUNSPTFQMR_MAXL_DEFAULT; }

  /* check that the supplied N_Vector supports all requisite operations */
  SUNAssertNull((y->ops->nvclone) && (y->ops->nvdestroy) &&
                  (y->ops->nvlinearsum) && (y->ops->nvconst) && (y->ops->nvprod) &&
                  (y->ops->nvdiv) && (y->ops->nvscale) && (y->ops->nvdotprod),
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPTFQMR;
  S->ops->getid             = SUNLinSolGetID_SPTFQMR;
  S->ops->setatimes         = SUNLinSolSetATimes_SPTFQMR;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPTFQMR;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPTFQMR;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPTFQMR;
  S->ops->initialize        = SUNLinSolInitialize_SPTFQMR;
  S->ops->setup             = SUNLinSolSetup_SPTFQMR;
  S->ops->solve             = SUNLinSolSolve_SPTFQMR;
  S->ops->numiters          = SUNLinSolNumIters_SPTFQMR;
  S->ops->resnorm           = SUNLinSolResNorm_SPTFQMR;
  S->ops->resid             = SUNLinSolResid_SPTFQMR;
  S->ops->lastflag          = SUNLinSolLastFlag_SPTFQMR;
  S->ops->space             = SUNLinSolSpace_SPTFQMR;
  S->ops->free              = SUNLinSolFree_SPTFQMR;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPTFQMR)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag = 0;
  content->maxl      = maxl;
  content->pretype   = pretype;
  content->zeroguess = SUNFALSE;
  content->numiters  = 0;
  content->resnorm   = ZERO;
  content->r_star    = NULL;
  content->q         = NULL;
  content->d         = NULL;
  content->v         = NULL;
  content->p         = NULL;
  content->r         = NULL;
  content->u         = NULL;
  content->vtemp1    = NULL;
  content->vtemp2    = NULL;
  content->vtemp3    = NULL;
  content->s1        = NULL;
  content->s2        = NULL;
  content->ATimes    = NULL;
  content->ATData    = NULL;
  content->Psetup    = NULL;
  content->Psolve    = NULL;
  content->PData     = NULL;

  /* Allocate content */
  content->r_star = N_VClone(y);
  SUNCheckLastErrNull();
  content->q = N_VClone(y);
  SUNCheckLastErrNull();
  content->d = N_VClone(y);
  SUNCheckLastErrNull();
  content->v = N_VClone(y);
  SUNCheckLastErrNull();
  content->p = N_VClone(y);
  SUNCheckLastErrNull();
  content->r = N_VCloneVectorArray(2, y);
  SUNCheckLastErrNull();
  content->u = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp1 = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp2 = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp3 = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}